

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O3

xmlEntityPtr xmlGetDocEntity(xmlDoc *doc,xmlChar *name)

{
  xmlHashTablePtr pxVar1;
  xmlEntityPtr pxVar2;
  
  if (doc != (xmlDoc *)0x0) {
    if (((doc->intSubset != (_xmlDtd *)0x0) &&
        (pxVar1 = (xmlHashTablePtr)doc->intSubset->entities, pxVar1 != (xmlHashTablePtr)0x0)) &&
       (pxVar2 = (xmlEntityPtr)xmlHashLookup(pxVar1,name), pxVar2 != (xmlEntityPtr)0x0)) {
      return pxVar2;
    }
    if (((doc->standalone != 1) && (doc->extSubset != (_xmlDtd *)0x0)) &&
       ((pxVar1 = (xmlHashTablePtr)doc->extSubset->entities, pxVar1 != (xmlHashTablePtr)0x0 &&
        (pxVar2 = (xmlEntityPtr)xmlHashLookup(pxVar1,name), pxVar2 != (xmlEntityPtr)0x0)))) {
      return pxVar2;
    }
  }
  pxVar2 = xmlGetPredefinedEntity(name);
  return pxVar2;
}

Assistant:

xmlEntityPtr
xmlGetDocEntity(const xmlDoc *doc, const xmlChar *name) {
    xmlEntityPtr cur;
    xmlEntitiesTablePtr table;

    if (doc != NULL) {
	if ((doc->intSubset != NULL) && (doc->intSubset->entities != NULL)) {
	    table = (xmlEntitiesTablePtr) doc->intSubset->entities;
	    cur = xmlGetEntityFromTable(table, name);
	    if (cur != NULL)
		return(cur);
	}
	if (doc->standalone != 1) {
	    if ((doc->extSubset != NULL) &&
		(doc->extSubset->entities != NULL)) {
		table = (xmlEntitiesTablePtr) doc->extSubset->entities;
		cur = xmlGetEntityFromTable(table, name);
		if (cur != NULL)
		    return(cur);
	    }
	}
    }
    return(xmlGetPredefinedEntity(name));
}